

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

bool __thiscall
btConvexHullInternal::mergeProjection
          (btConvexHullInternal *this,IntermediateHull *h0,IntermediateHull *h1,Vertex **c0,
          Vertex **c1)

{
  long lVar1;
  Vertex *pVVar2;
  Vertex *pVVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_R8;
  int32_t dy1_1;
  int32_t dx1_1;
  Vertex *w1_1;
  int32_t dy_1;
  int32_t dxn;
  int32_t dy1;
  int32_t dx1;
  Vertex *w1;
  int32_t dy0;
  int32_t dx0;
  Vertex *w0;
  int32_t dy;
  int32_t dx;
  int side;
  int32_t sign;
  Vertex *v10;
  Vertex *v00;
  Vertex *v1n;
  Vertex *v1p;
  Vertex *v1;
  Vertex *v0;
  Vertex *local_120;
  Vertex *local_110;
  Vertex *local_108;
  Vertex *local_100;
  Vertex *local_f8;
  Vertex *local_f0;
  Vertex *local_e8;
  int local_dc;
  Vertex *local_d0;
  int local_c4;
  int local_6c;
  int local_68;
  int local_64;
  Vertex *local_60;
  Vertex *local_58;
  Vertex *w1_2;
  Vertex *pVStack_38;
  int32_t y1;
  Vertex *t;
  Vertex *w0_2;
  int32_t y0;
  int32_t x;
  int32_t dxn_1;
  int32_t dy0_1;
  int32_t dx0_1;
  Vertex *w0_1;
  
  lVar1 = in_RSI[3];
  w1_2 = (Vertex *)in_RDX[2];
  if ((*(int *)(lVar1 + 0x68) == (w1_2->point).x) && (*(int *)(lVar1 + 0x6c) == (w1_2->point).y)) {
    pVVar2 = w1_2->prev;
    if (pVVar2 == w1_2) {
      *in_RCX = lVar1;
      if (w1_2->edges != (Edge *)0x0) {
        w1_2 = w1_2->edges->target;
      }
      *in_R8 = (long)w1_2;
      return false;
    }
    pVVar3 = w1_2->next;
    pVVar2->next = pVVar3;
    pVVar3->prev = pVVar2;
    if (w1_2 == (Vertex *)*in_RDX) {
      if (((pVVar3->point).x < (pVVar2->point).x) ||
         (((pVVar3->point).x == (pVVar2->point).x && ((pVVar3->point).y < (pVVar2->point).y)))) {
        *in_RDX = (long)pVVar3;
      }
      else {
        *in_RDX = (long)pVVar2;
      }
    }
    if (w1_2 == (Vertex *)in_RDX[1]) {
      if (((pVVar2->point).x < (pVVar3->point).x) ||
         (((pVVar3->point).x == (pVVar2->point).x && ((pVVar2->point).y < (pVVar3->point).y)))) {
        in_RDX[1] = (long)pVVar3;
      }
      else {
        in_RDX[1] = (long)pVVar2;
      }
    }
  }
  pVStack_38 = (Vertex *)in_RSI[1];
  w1_2 = (Vertex *)in_RDX[1];
  local_58 = (Vertex *)0x0;
  local_60 = (Vertex *)0x0;
  local_64 = 1;
  local_68 = 0;
  do {
    if (1 < local_68) {
      pVStack_38->prev = w1_2;
      w1_2->next = pVStack_38;
      local_58->next = local_60;
      local_60->prev = local_58;
      if (*(int *)(*in_RDX + 0x68) < *(int *)(*in_RSI + 0x68)) {
        *in_RSI = *in_RDX;
      }
      if (*(int *)(in_RSI[1] + 0x68) <= *(int *)(in_RDX[1] + 0x68)) {
        in_RSI[1] = in_RDX[1];
      }
      in_RSI[3] = in_RDX[3];
      *in_RCX = (long)local_58;
      *in_R8 = (long)local_60;
      return true;
    }
    local_6c = ((w1_2->point).x - (pVStack_38->point).x) * local_64;
    if (0 < local_6c) {
LAB_0014a656:
      do {
        iVar5 = (w1_2->point).y - (pVStack_38->point).y;
        if (local_68 == 0) {
          local_f0 = pVStack_38->prev;
        }
        else {
          local_f0 = pVStack_38->next;
        }
        if (local_f0 != pVStack_38) {
          iVar6 = ((local_f0->point).x - (pVStack_38->point).x) * local_64;
          iVar7 = (local_f0->point).y - (pVStack_38->point).y;
          if ((iVar7 < 1) && ((iVar6 == 0 || ((iVar6 < 0 && (iVar7 * local_6c <= iVar5 * iVar6))))))
          {
            pVStack_38 = local_f0;
            local_6c = ((w1_2->point).x - (local_f0->point).x) * local_64;
            goto LAB_0014a656;
          }
        }
        if (local_68 == 0) {
          local_f8 = w1_2->prev;
        }
        else {
          local_f8 = w1_2->next;
        }
        if (local_f8 == w1_2) goto LAB_0014ab0c;
        iVar6 = ((local_f8->point).x - (w1_2->point).x) * local_64;
        iVar7 = (local_f8->point).y - (w1_2->point).y;
        iVar8 = ((local_f8->point).x - (pVStack_38->point).x) * local_64;
        if (((iVar8 < 1) || (-1 < iVar7)) ||
           ((iVar6 != 0 && ((-1 < iVar6 || (iVar5 * iVar6 <= iVar7 * local_6c))))))
        goto LAB_0014ab0c;
        w1_2 = local_f8;
        local_6c = iVar8;
      } while( true );
    }
    if (local_6c < 0) {
LAB_0014a80d:
      do {
        iVar5 = (w1_2->point).y - (pVStack_38->point).y;
        if (local_68 == 0) {
          local_100 = w1_2->next;
        }
        else {
          local_100 = w1_2->prev;
        }
        if (local_100 != w1_2) {
          iVar6 = ((local_100->point).x - (w1_2->point).x) * local_64;
          iVar7 = (local_100->point).y - (w1_2->point).y;
          if ((-1 < iVar7) && ((iVar6 == 0 || ((iVar6 < 0 && (iVar7 * local_6c <= iVar5 * iVar6)))))
             ) {
            w1_2 = local_100;
            local_6c = ((local_100->point).x - (pVStack_38->point).x) * local_64;
            goto LAB_0014a80d;
          }
        }
        if (local_68 == 0) {
          local_108 = pVStack_38->next;
        }
        else {
          local_108 = pVStack_38->prev;
        }
        if (local_108 == pVStack_38) goto LAB_0014ab0c;
        iVar6 = ((local_108->point).x - (pVStack_38->point).x) * local_64;
        iVar7 = (local_108->point).y - (pVStack_38->point).y;
        iVar8 = ((w1_2->point).x - (local_108->point).x) * local_64;
        if (((-1 < iVar8) || (iVar7 < 1)) ||
           ((iVar6 != 0 && ((-1 < iVar6 || (iVar5 * iVar6 <= iVar7 * local_6c))))))
        goto LAB_0014ab0c;
        pVStack_38 = local_108;
        local_6c = iVar8;
      } while( true );
    }
    iVar5 = (pVStack_38->point).x;
    local_c4 = (pVStack_38->point).y;
    local_d0 = pVStack_38;
    while( true ) {
      if (local_68 == 0) {
        local_110 = local_d0->prev;
      }
      else {
        local_110 = local_d0->next;
      }
      bVar4 = false;
      if ((local_110 != pVStack_38) && (bVar4 = false, (local_110->point).x == iVar5)) {
        bVar4 = (local_110->point).y <= local_c4;
      }
      if (!bVar4) break;
      local_d0 = local_110;
      local_c4 = (local_110->point).y;
    }
    pVStack_38 = local_d0;
    local_dc = (w1_2->point).y;
    local_e8 = w1_2;
    while( true ) {
      if (local_68 == 0) {
        local_120 = local_e8->next;
      }
      else {
        local_120 = local_e8->prev;
      }
      bVar4 = false;
      if ((local_120 != w1_2) && (bVar4 = false, (local_120->point).x == iVar5)) {
        bVar4 = local_dc <= (local_120->point).y;
      }
      if (!bVar4) break;
      local_e8 = local_120;
      local_dc = (local_120->point).y;
    }
    w1_2 = local_e8;
LAB_0014ab0c:
    if (local_68 == 0) {
      local_58 = pVStack_38;
      local_60 = w1_2;
      pVStack_38 = (Vertex *)*in_RSI;
      w1_2 = (Vertex *)*in_RDX;
      local_64 = -1;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

bool btConvexHullInternal::mergeProjection(IntermediateHull& h0, IntermediateHull& h1, Vertex*& c0, Vertex*& c1)
{
	Vertex* v0 = h0.maxYx;
	Vertex* v1 = h1.minYx;
	if ((v0->point.x == v1->point.x) && (v0->point.y == v1->point.y))
	{
		btAssert(v0->point.z < v1->point.z);
		Vertex* v1p = v1->prev;
		if (v1p == v1)
		{
			c0 = v0;
			if (v1->edges)
			{
				btAssert(v1->edges->next == v1->edges);
				v1 = v1->edges->target;
				btAssert(v1->edges->next == v1->edges);
			}
			c1 = v1;
			return false;
		}
		Vertex* v1n = v1->next;
		v1p->next = v1n;
		v1n->prev = v1p;
		if (v1 == h1.minXy)
		{
			if ((v1n->point.x < v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y < v1p->point.y)))
			{
				h1.minXy = v1n;
			}
			else
			{
				h1.minXy = v1p;
			}
		}
		if (v1 == h1.maxXy)
		{
			if ((v1n->point.x > v1p->point.x) || ((v1n->point.x == v1p->point.x) && (v1n->point.y > v1p->point.y)))
			{
				h1.maxXy = v1n;
			}
			else
			{
				h1.maxXy = v1p;
			}
		}
	}
	
	v0 = h0.maxXy;
	v1 = h1.maxXy;
	Vertex* v00 = NULL;
	Vertex* v10 = NULL;
	int32_t sign = 1;

	for (int side = 0; side <= 1; side++)
	{		
		int32_t dx = (v1->point.x - v0->point.x) * sign;
		if (dx > 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;

				Vertex* w0 = side ? v0->next : v0->prev;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					if ((dy0 <= 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx <= dy * dx0))))
					{
						v0 = w0;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}

				Vertex* w1 = side ? v1->next : v1->prev;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					int32_t dxn = (w1->point.x - v0->point.x) * sign;
					if ((dxn > 0) && (dy1 < 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx < dy * dx1))))
					{
						v1 = w1;
						dx = dxn;
						continue;
					}
				}

				break;
			}
		}
		else if (dx < 0)
		{
			while (true)
			{
				int32_t dy = v1->point.y - v0->point.y;
				
				Vertex* w1 = side ? v1->prev : v1->next;
				if (w1 != v1)
				{
					int32_t dx1 = (w1->point.x - v1->point.x) * sign;
					int32_t dy1 = w1->point.y - v1->point.y;
					if ((dy1 >= 0) && ((dx1 == 0) || ((dx1 < 0) && (dy1 * dx <= dy * dx1))))
					{
						v1 = w1;
						dx = (v1->point.x - v0->point.x) * sign;
						continue;
					}
				}
				
				Vertex* w0 = side ? v0->prev : v0->next;
				if (w0 != v0)
				{
					int32_t dx0 = (w0->point.x - v0->point.x) * sign;
					int32_t dy0 = w0->point.y - v0->point.y;
					int32_t dxn = (v1->point.x - w0->point.x) * sign;
					if ((dxn < 0) && (dy0 > 0) && ((dx0 == 0) || ((dx0 < 0) && (dy0 * dx < dy * dx0))))
					{
						v0 = w0;
						dx = dxn;
						continue;
					}
				}
				
				break;
			}
		}
		else
		{
			int32_t x = v0->point.x;
			int32_t y0 = v0->point.y;
			Vertex* w0 = v0;
			Vertex* t;
			while (((t = side ? w0->next : w0->prev) != v0) && (t->point.x == x) && (t->point.y <= y0))
			{
				w0 = t;
				y0 = t->point.y;
			}
			v0 = w0;

			int32_t y1 = v1->point.y;
			Vertex* w1 = v1;
			while (((t = side ? w1->prev : w1->next) != v1) && (t->point.x == x) && (t->point.y >= y1))
			{
				w1 = t;
				y1 = t->point.y;
			}
			v1 = w1;
		}
		
		if (side == 0)
		{
			v00 = v0;
			v10 = v1;

			v0 = h0.minXy;
			v1 = h1.minXy;
			sign = -1;
		}
	}

	v0->prev = v1;
	v1->next = v0;

	v00->next = v10;
	v10->prev = v00;

	if (h1.minXy->point.x < h0.minXy->point.x)
	{
		h0.minXy = h1.minXy;
	}
	if (h1.maxXy->point.x >= h0.maxXy->point.x)
	{
		h0.maxXy = h1.maxXy;
	}
	
	h0.maxYx = h1.maxYx;

	c0 = v00;
	c1 = v10;

	return true;
}